

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printLabel(JSPrinter *this,Ref node)

{
  Ref *this_00;
  Value *this_01;
  char *s;
  undefined8 *puVar1;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
  this_01 = Ref::operator->(this_00);
  s = Value::getCString(this_01);
  emit(this,s);
  space(this);
  emit(this,':');
  space(this);
  puVar1 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
  print(this,(Value *)*puVar1);
  return;
}

Assistant:

void printLabel(Ref node) {
    emit(node[1]->getCString());
    space();
    emit(':');
    space();
    print(node[2]);
  }